

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2raster.cpp
# Opt level: O2

uint8 * rw::ps2::rasterLock(Raster *raster,int32 level,int32 lockMode)

{
  int iVar1;
  int iVar2;
  uint8 *puVar3;
  bool bVar4;
  int32 iVar5;
  int32 iVar6;
  int32 minh;
  int32 minw;
  
  if (0 < level) {
    transferMinSize((((uint)raster->format >> 0xe & 1) != 0) + 0x13,
                    (int)*(char *)((long)&raster->pixels + (long)nativeRasterOffset + 4),&minw,&minh
                   );
    iVar5 = raster->width;
    iVar6 = raster->height;
    puVar3 = raster->pixels;
    while (bVar4 = level != 0, level = level + -1, bVar4) {
      iVar1 = iVar5;
      if (iVar5 <= minw) {
        iVar1 = minw;
      }
      iVar2 = iVar6;
      if (iVar6 <= minh) {
        iVar2 = minh;
      }
      puVar3 = puVar3 + (long)(int)((iVar1 * raster->depth * iVar2) / 8 + 0xfU & 0xfffffff0) + 0x50;
      iVar5 = iVar5 / 2;
      iVar6 = iVar6 / 2;
    }
    raster->width = iVar5;
    raster->height = iVar6;
    raster->pixels = puVar3;
  }
  if ((lockMode & 4U) == 0) {
    unswizzleRaster(raster);
  }
  if ((lockMode & 2U) != 0) {
    *(byte *)&raster->privateFlags = (byte)raster->privateFlags | 2;
  }
  if ((lockMode & 1U) != 0) {
    *(byte *)&raster->privateFlags = (byte)raster->privateFlags | 4;
  }
  return raster->pixels;
}

Assistant:

uint8*
rasterLock(Raster *raster, int32 level, int32 lockMode)
{
	Ps2Raster *natras = GETPS2RASTEREXT(raster);
	assert(raster->depth != 24);

	if(level > 0){
		int32 minw, minh;
		int32 mipw, miph;
		transferMinSize(raster->format & Raster::PAL4 ? PSMT4 : PSMT8, natras->flags, &minw, &minh);
		while(level--){
			mipw = max(raster->width, minw);
			miph = max(raster->height, minh);
			raster->pixels += ALIGN16(mipw*miph*raster->depth/8) + 0x50;
			raster->width /= 2;
			raster->height /= 2;
		}
	}

	if((lockMode & Raster::LOCKNOFETCH) == 0)
		unswizzleRaster(raster);
	if(lockMode & Raster::LOCKREAD) raster->privateFlags |= Raster::PRIVATELOCK_READ;
	if(lockMode & Raster::LOCKWRITE) raster->privateFlags |= Raster::PRIVATELOCK_WRITE;
	return raster->pixels;
}